

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatFile.h
# Opt level: O2

void __thiscall
FlatFile<int,_int>::FlatFile(FlatFile<int,_int> *this,ion_dictionary_config_info_t config)

{
  int __oflag;
  char *in_RSI;
  
  ffdict_init((ion_dictionary_handler_t *)this);
  Dictionary<int,_int>::open(&this->super_Dictionary<int,_int>,in_RSI,__oflag);
  return;
}

Assistant:

FlatFile(
	ion_dictionary_config_info_t config
) {
	ffdict_init(&this->handler);

	this->open(config);
}